

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O0

void ontostack(bucket_conflict1 *b,int pos)

{
  boolean bVar1;
  list plVar2;
  stack *psVar3;
  int pos_local;
  bucket_conflict1 *b_local;
  
  b->tail->next = (list)0x0;
  if (b->size < 0x15) {
    if (1 < b->size) {
      plVar2 = ListInsertsort(b->head,&b->tail,pos);
      b->head = plVar2;
    }
    b->size = 0;
  }
  if (b->size == 0) {
    bVar1 = stackempty();
    if (bVar1 == 0) {
      psVar3 = top();
      if (psVar3->size == 0) {
        plVar2 = b->head;
        psVar3 = top();
        psVar3->tail->next = plVar2;
        plVar2 = b->tail;
        psVar3 = top();
        psVar3->tail = plVar2;
        goto LAB_0031a4ae;
      }
    }
  }
  push(b->head,b->tail,b->size,pos);
  b->size = 0;
LAB_0031a4ae:
  b->head = (list)0x0;
  return;
}

Assistant:

static void ontostack(bucket *b, int pos)
{
   b->tail->next = NULL;
   if (b->size <= INSERTBREAK) {
      if (b->size > 1)
         b->head = ListInsertsort(b->head, &b->tail, pos);
      b->size = 0;   /* sorted */
   }
   if (!b->size && !stackempty() && !top()->size) {
      top()->tail->next = b->head;
      top()->tail = b->tail;
   }
   else {
      push(b->head, b->tail, b->size, pos);
      b->size = 0;
   }
   b->head = NULL;
}